

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O2

int __thiscall
VC1StreamReader::writeAdditionData
          (VC1StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  int iVar1;
  pointer puVar2;
  pointer puVar3;
  undefined4 *puVar4;
  ulong uVar5;
  uint8_t *puVar6;
  uint *local_1d8;
  undefined8 local_1d0;
  uint local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  uint *local_1b8;
  undefined8 local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  ostringstream ss;
  
  iVar1 = (this->super_MPEGStreamReader).m_totalFrameNum;
  puVar6 = dstBuffer;
  if ((((1 < iVar1) && (this->m_spsFound < 2)) && ((this->m_frame).pict_type == I_TYPE)) ||
     (((1 < iVar1 && (this->m_firstFileFrame == true)) && (this->m_decodedAfterSeq == false)))) {
    this->m_firstFileFrame = false;
    puVar2 = (this->m_seqBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->m_seqBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 != puVar3) {
      uVar5 = (long)puVar3 - (long)puVar2;
      if ((ulong)((long)dstEnd - (long)dstBuffer) < uVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::operator<<((ostream *)&ss,"VC1 stream error: Not enough buffer for write headers");
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 3;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_1b8 == &local_1a8) {
          puVar4[6] = local_1a8;
          puVar4[7] = uStack_1a4;
          puVar4[8] = uStack_1a0;
          puVar4[9] = uStack_19c;
        }
        else {
          *(uint **)(puVar4 + 2) = local_1b8;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1a4,local_1a8);
        }
        *(undefined8 *)(puVar4 + 4) = local_1b0;
        local_1b0 = 0;
        local_1a8 = local_1a8 & 0xffffff00;
        local_1b8 = &local_1a8;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      memcpy(dstBuffer,puVar2,uVar5);
      puVar6 = dstBuffer +
               ((long)(this->m_seqBuffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_seqBuffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    }
    puVar2 = (this->m_entryPointBuffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->m_entryPointBuffer).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar2 != puVar3) {
      uVar5 = (long)puVar3 - (long)puVar2;
      if ((ulong)((long)dstEnd - (long)puVar6) < uVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
        std::operator<<((ostream *)&ss,"VC1 stream error: Not enough buffer for write headers");
        puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        *puVar4 = 3;
        *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
        if (local_1d8 == &local_1c8) {
          puVar4[6] = local_1c8;
          puVar4[7] = uStack_1c4;
          puVar4[8] = uStack_1c0;
          puVar4[9] = uStack_1bc;
        }
        else {
          *(uint **)(puVar4 + 2) = local_1d8;
          *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1c4,local_1c8);
        }
        *(undefined8 *)(puVar4 + 4) = local_1d0;
        local_1c8 = local_1c8 & 0xffffff00;
        __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      memcpy(puVar6,puVar2,uVar5);
      puVar6 = puVar6 + ((long)(this->m_entryPointBuffer).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_entryPointBuffer).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (int)puVar6 - (int)dstBuffer;
}

Assistant:

int VC1StreamReader::writeAdditionData(uint8_t* dstBuffer, uint8_t* dstEnd, AVPacket& avPacket,
                                       PriorityDataInfo* priorityData)
{
    // uint8_t* afterPesData = (uint8_t*)pesPacket + pesPacket->getHeaderLength();
    uint8_t* curPtr = dstBuffer;  // afterPesData;
    if ((m_totalFrameNum > 1 && m_spsFound < 2 && m_frame.pict_type == VC1PictType::I_TYPE) ||
        (m_totalFrameNum > 1 && m_firstFileFrame && !m_decodedAfterSeq))
    {
        m_firstFileFrame = false;
        if (!m_seqBuffer.empty())
        {
            if (static_cast<size_t>(dstEnd - curPtr) < m_seqBuffer.size())
                THROW(ERR_COMMON, "VC1 stream error: Not enough buffer for write headers")
            memcpy(curPtr, m_seqBuffer.data(), m_seqBuffer.size());
            curPtr += m_seqBuffer.size();
        }
        if (!m_entryPointBuffer.empty())
        {
            if (static_cast<size_t>(dstEnd - curPtr) < m_entryPointBuffer.size())
                THROW(ERR_COMMON, "VC1 stream error: Not enough buffer for write headers")
            memcpy(curPtr, m_entryPointBuffer.data(), m_entryPointBuffer.size());
            curPtr += m_entryPointBuffer.size();
        }
    }
    return static_cast<int>(curPtr - dstBuffer);  // afterPesData;
}